

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

void __thiscall ncnn::GRU::GRU(GRU *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__GRU_009bd5d0;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x1c));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x25));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2e));
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

GRU::GRU()
{
    one_blob_only = false;
    support_inplace = false;
}